

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int gctm(lua_State *L)

{
  void *lib;
  undefined8 local_18;
  lua_Integer n;
  lua_State *L_local;
  
  for (local_18 = luaL_len(L,1); 0 < local_18; local_18 = local_18 + -1) {
    lua_rawgeti(L,1,local_18);
    lib = lua_touserdata(L,-1);
    lsys_unloadlib(lib);
    lua_settop(L,-2);
  }
  return 0;
}

Assistant:

static int gctm (lua_State *L) {
  lua_Integer n = luaL_len(L, 1);
  for (; n >= 1; n--) {  /* for each handle, in reverse order */
    lua_rawgeti(L, 1, n);  /* get handle CLIBS[n] */
    lsys_unloadlib(lua_touserdata(L, -1));
    lua_pop(L, 1);  /* pop handle */
  }
  return 0;
}